

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcEdgeLogLikelihoodsByPartitionAsync
          (BeagleCPUImpl<double,_1,_0> *this,int *parentBufferIndices,int *childBufferIndices,
          int *probabilityIndices,int *categoryWeightsIndices,int *stateFrequenciesIndices,
          int *cumulativeScaleIndices,int *partitionIndices,int partitionCount,
          double *outSumLogLikelihoodByPartition)

{
  uint uVar1;
  threadData *ptVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  packaged_task<void_()> *__args;
  long lVar6;
  int i;
  int partitionCountThread;
  uint local_144;
  int local_140;
  int local_13c;
  __shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2> local_138;
  long local_128;
  int *local_120;
  int *local_118;
  int *local_110;
  int *local_108;
  int *local_100;
  long local_f8;
  double *local_f0;
  int *local_e8;
  int *local_e0;
  int *local_d8;
  int *local_d0;
  int *local_c8;
  int *local_c0;
  int *local_b8;
  BeagleCPUImpl<double,_1,_0> *local_b0;
  packaged_task<void_()> threadTask;
  unique_lock<std::mutex> l;
  
  uVar1 = this->kNumThreads;
  __args = (packaged_task<void_()> *)(ulong)uVar1;
  lVar6 = 0x88;
  local_13c = partitionCount / (int)uVar1;
  uVar4 = (long)partitionCount % (long)(int)uVar1 & 0xffffffff;
  if ((int)uVar1 < partitionCount) {
    partitionCount = uVar1;
  }
  iVar5 = 0;
  local_140 = local_13c + 1;
  local_f8 = (ulong)(uint)(~(partitionCount >> 0x1f) & partitionCount) << 4;
  lVar3 = 0;
  local_120 = parentBufferIndices;
  local_118 = childBufferIndices;
  local_110 = probabilityIndices;
  local_108 = categoryWeightsIndices;
  local_100 = stateFrequenciesIndices;
  while (local_f8 != lVar3) {
    partitionCountThread = local_13c;
    if ((int)uVar4 == 0) {
      local_144 = 0;
    }
    else {
      local_144 = (int)uVar4 - 1;
      partitionCountThread = local_140;
    }
    local_138 = (__shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
                 )ZEXT816(0x279);
    local_b8 = local_120 + iVar5;
    local_c0 = local_118 + iVar5;
    local_c8 = local_110 + iVar5;
    local_d0 = local_108 + iVar5;
    local_d8 = local_100 + iVar5;
    local_e0 = cumulativeScaleIndices + iVar5;
    local_e8 = partitionIndices + iVar5;
    local_f0 = outSumLogLikelihoodByPartition + iVar5;
    local_128 = lVar3;
    local_b0 = this;
    std::
    _Bind<void(beagle::cpu::BeagleCPUImpl<double,1,0>::*(beagle::cpu::BeagleCPUImpl<double,1,0>*,int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int,double*))(int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int,double*)>
    ::
    _Bind<beagle::cpu::BeagleCPUImpl<double,1,0>*,int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int&,double*>
              ((_Bind<void(beagle::cpu::BeagleCPUImpl<double,1,0>::*(beagle::cpu::BeagleCPUImpl<double,1,0>*,int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int,double*))(int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int,double*)>
                *)&l,(offset_in_BeagleCPUImpl<double,_1,_0>_to_subr *)&local_138,&local_b0,&local_b8
               ,&local_c0,&local_c8,&local_d0,&local_d8,&local_e0,&local_e8,&partitionCountThread,
               &local_f0);
    std::packaged_task<void()>::
    packaged_task<std::_Bind<void(beagle::cpu::BeagleCPUImpl<double,1,0>::*(beagle::cpu::BeagleCPUImpl<double,1,0>*,int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int,double*))(int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int,double*)>,void>
              ((packaged_task<void()> *)&threadTask,
               (_Bind<void_(beagle::cpu::BeagleCPUImpl<double,_1,_0>::*(beagle::cpu::BeagleCPUImpl<double,_1,_0>_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_int,_double_*))(const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_int,_double_*)>
                *)&l);
    std::packaged_task<void_()>::get_future((packaged_task<void_()> *)&local_138);
    l._M_device = (mutex_type *)local_138._M_ptr;
    l._8_8_ = local_138._M_refcount._M_pi;
    local_138 = (__shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
                 )(ZEXT816(0) << 0x20);
    std::shared_future<void>::operator=
              ((shared_future<void> *)
               ((long)&(this->gFutures->super___basic_future<void>)._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + local_128),(shared_future<void> *)&l);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&l._M_owns);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138._M_refcount);
    ptVar2 = this->gThreads;
    std::unique_lock<std::mutex>::unique_lock
              (&l,(mutex_type *)((long)&(ptVar2->t)._M_id._M_thread + lVar6));
    __args = &threadTask;
    std::deque<std::packaged_task<void()>,std::allocator<std::packaged_task<void()>>>::
    emplace_back<std::packaged_task<void()>>
              ((deque<std::packaged_task<void()>,std::allocator<std::packaged_task<void()>>> *)
               ((long)ptVar2 + lVar6 + -0x80),__args);
    std::unique_lock<std::mutex>::unlock(&l);
    std::condition_variable::notify_one();
    iVar5 = iVar5 + partitionCountThread;
    std::unique_lock<std::mutex>::~unique_lock(&l);
    std::packaged_task<void_()>::~packaged_task(&threadTask);
    uVar4 = (ulong)local_144;
    lVar6 = lVar6 + 0xb8;
    lVar3 = local_128 + 0x10;
  }
  lVar6 = 0;
  for (lVar3 = 0; lVar3 < this->kNumThreads; lVar3 = lVar3 + 1) {
    std::__basic_future<void>::wait
              ((__basic_future<void> *)
               ((long)&(this->gFutures->super___basic_future<void>)._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + lVar6),__args);
    lVar6 = lVar6 + 0x10;
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
    void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsByPartitionAsync(
                                                        const int* parentBufferIndices,
                                                        const int* childBufferIndices,
                                                        const int* probabilityIndices,
                                                        const int* categoryWeightsIndices,
                                                        const int* stateFrequenciesIndices,
                                                        const int* cumulativeScaleIndices,
                                                        const int* partitionIndices,
                                                        int partitionCount,
                                                        double* outSumLogLikelihoodByPartition) {

    int partitionsPerThreadFloor = partitionCount / kNumThreads;
    int partitionsRemainder = partitionCount % kNumThreads;
    int currentPartitionIndex = 0;
    int threadsUsed = (partitionCount < kNumThreads ? partitionCount : kNumThreads);
    for (int i=0; i<threadsUsed; i++) {
        int partitionCountThread = partitionsPerThreadFloor;
        if (partitionsRemainder) {
            partitionCountThread++;
            partitionsRemainder--;
        }

        std::packaged_task<void()> threadTask(
            std::bind(&BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsByPartition, this,
                      &parentBufferIndices[currentPartitionIndex],
                      &childBufferIndices[currentPartitionIndex],
                      &probabilityIndices[currentPartitionIndex],
                      &categoryWeightsIndices[currentPartitionIndex],
                      &stateFrequenciesIndices[currentPartitionIndex],
                      &cumulativeScaleIndices[currentPartitionIndex],
                      &partitionIndices[currentPartitionIndex],
                      partitionCountThread,
                      &outSumLogLikelihoodByPartition[currentPartitionIndex]));

        gFutures[i] = threadTask.get_future();
        threadData* td = &gThreads[i];

        std::unique_lock<std::mutex> l(td->m);
        td->jobs.push(std::move(threadTask));
        l.unlock();

        gThreads[i].cv.notify_one();

        currentPartitionIndex += partitionCountThread;
    }

    for (int i=0; i<kNumThreads; i++) {
        gFutures[i].wait();
    }

}